

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int hdr_init(int64_t lowest_discernible_value,int64_t highest_trackable_value,
            int significant_figures,hdr_histogram **result)

{
  hdr_histogram *h;
  int r;
  hdr_histogram *histogram;
  hdr_histogram_bucket_config cfg;
  int64_t *counts;
  hdr_histogram **result_local;
  int significant_figures_local;
  int64_t highest_trackable_value_local;
  int64_t lowest_discernible_value_local;
  
  lowest_discernible_value_local._4_4_ =
       hdr_calculate_bucket_config
                 (lowest_discernible_value,highest_trackable_value,significant_figures,
                  (hdr_histogram_bucket_config *)&histogram);
  if (lowest_discernible_value_local._4_4_ == 0) {
    cfg._56_8_ = calloc((long)cfg.sub_bucket_count,8);
    if ((void *)cfg._56_8_ == (void *)0x0) {
      lowest_discernible_value_local._4_4_ = 0xc;
    }
    else {
      h = (hdr_histogram *)calloc(1,0x68);
      if (h == (hdr_histogram *)0x0) {
        free((void *)cfg._56_8_);
        lowest_discernible_value_local._4_4_ = 0xc;
      }
      else {
        h->counts = (int64_t *)cfg._56_8_;
        hdr_init_preallocated(h,(hdr_histogram_bucket_config *)&histogram);
        *result = h;
        lowest_discernible_value_local._4_4_ = 0;
      }
    }
  }
  return lowest_discernible_value_local._4_4_;
}

Assistant:

int hdr_init(
    int64_t lowest_discernible_value,
    int64_t highest_trackable_value,
    int significant_figures,
    struct hdr_histogram** result)
{
    int64_t* counts;
    struct hdr_histogram_bucket_config cfg;
    struct hdr_histogram* histogram;

    int r = hdr_calculate_bucket_config(lowest_discernible_value, highest_trackable_value, significant_figures, &cfg);
    if (r)
    {
        return r;
    }

    counts = (int64_t*) hdr_calloc((size_t) cfg.counts_len, sizeof(int64_t));
    if (!counts)
    {
        return ENOMEM;
    }

    histogram = (struct hdr_histogram*) hdr_calloc(1, sizeof(struct hdr_histogram));
    if (!histogram)
    {
        hdr_free(counts);
        return ENOMEM;
    }

    histogram->counts = counts;

    hdr_init_preallocated(histogram, &cfg);
    *result = histogram;

    return 0;
}